

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O2

void __thiscall Pl_StdioFile::~Pl_StdioFile(Pl_StdioFile *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_StdioFile_002ae800;
  std::unique_ptr<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>::~unique_ptr
            (&this->m);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_StdioFile::~Pl_StdioFile() = default;